

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcProcedure::IfcProcedure(IfcProcedure *this)

{
  IfcProcedure *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x158,"IfcProcedure");
  IfcProcess::IfcProcess((IfcProcess *)this,&PTR_construction_vtable_24__00f5aa50);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcProcedure,_3UL>::ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProcedure,_3UL>,
             &PTR_construction_vtable_24__00f5ab00);
  *(undefined8 *)this = 0xf5a970;
  *(undefined8 *)&this->field_0x158 = 0xf5aa38;
  *(undefined8 *)&this->field_0x88 = 0xf5a998;
  *(undefined8 *)&this->field_0x98 = 0xf5a9c0;
  *(undefined8 *)&this->field_0xd0 = 0xf5a9e8;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProcedure,_3UL>)._vptr_ObjectHelper =
       (_func_int **)0xf5aa10;
  std::__cxx11::string::string
            ((string *)
             &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProcedure,_3UL>).field_0x10);
  std::__cxx11::string::string((string *)&this->ProcedureType);
  STEP::Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Maybe(&this->UserDefinedProcedureType);
  return;
}

Assistant:

IfcProcedure() : Object("IfcProcedure") {}